

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

void __thiscall
wasm::BufferWithRandomAccess::writeTo<wasm::Output>(BufferWithRandomAccess *this,Output *o)

{
  pointer puVar1;
  pointer puVar2;
  
  puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::operator<<(&o->out,*puVar2);
  }
  return;
}

Assistant:

void writeTo(T& o) {
    for (auto c : *this) {
      o << c;
    }
  }